

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particleSamples.cpp
# Opt level: O0

int __thiscall particleSamples::read_in_particle_samples_mixed_event_binary(particleSamples *this)

{
  ulong uVar1;
  vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
  *this_00;
  vector<particle_info,_std::allocator<particle_info>_> *in_RDI;
  particle_info temp_particle_info;
  float temp;
  int i;
  float array [9];
  int pdg;
  int ipart;
  int n_particle;
  int num_particles;
  int ievent;
  value_type *in_stack_ffffffffffffff08;
  value_type *__x;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  particleSamples *in_stack_ffffffffffffff30;
  undefined4 local_60;
  int local_5c;
  undefined4 local_58 [12];
  undefined4 local_28;
  int local_24;
  vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
  *local_20;
  int local_14;
  int local_10;
  int local_c;
  
  clear_out_previous_record
            (in_stack_ffffffffffffff30,
             (vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
              *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  local_c = 0;
  local_10 = 0;
  while( true ) {
    if (*(int *)&in_RDI[0x3f].super__Vector_base<particle_info,_std::allocator<particle_info>_>.
                 _M_impl.super__Vector_impl_data._M_finish <= local_10) {
      return 0;
    }
    local_14 = 0;
    std::istream::read((char *)&in_RDI[0x28].
                                super__Vector_base<particle_info,_std::allocator<particle_info>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,(long)&local_14);
    uVar1 = std::ios::eof();
    if ((uVar1 & 1) != 0) break;
    __x = in_RDI[0x46].super__Vector_base<particle_info,_std::allocator<particle_info>_>._M_impl.
          super__Vector_impl_data._M_finish;
    this_00 = (vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
               *)operator_new(0x18);
    std::vector<particle_info,_std::allocator<particle_info>_>::vector
              ((vector<particle_info,_std::allocator<particle_info>_> *)0x14e1b1);
    local_20 = this_00;
    std::
    vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
    ::push_back(this_00,in_stack_ffffffffffffff08);
    for (local_24 = 0; local_24 < local_14; local_24 = local_24 + 1) {
      local_28 = 0;
      std::istream::read((char *)&in_RDI[0x28].
                                  super__Vector_base<particle_info,_std::allocator<particle_info>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,(long)&local_28)
      ;
      for (local_5c = 0; local_5c < 9; local_5c = local_5c + 1) {
        local_60 = 0;
        std::istream::read((char *)&in_RDI[0x28].
                                    super__Vector_base<particle_info,_std::allocator<particle_info>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           (long)&local_60);
        local_58[local_5c] = local_60;
      }
      std::
      vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
      ::operator[]((vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                    *)in_RDI[0x46].super__Vector_base<particle_info,_std::allocator<particle_info>_>
                      ._M_impl.super__Vector_impl_data._M_finish,(long)local_c);
      std::vector<particle_info,_std::allocator<particle_info>_>::push_back(in_RDI,__x);
    }
    local_10 = local_14 + local_10;
  }
  return 0;
}

Assistant:

int particleSamples::read_in_particle_samples_mixed_event_binary() {
    // clean out the previous record
    clear_out_previous_record(full_particle_list_mixed_event);
    int ievent = 0;
    int num_particles = 0;
    while (num_particles < event_buffer_size) {
        int n_particle = 0;
        inputfile_mixed_event.read(
            reinterpret_cast<char *>(&n_particle), sizeof(int));

        if (inputfile_mixed_event.eof()) break;

        // create one event
        full_particle_list_mixed_event->push_back(new vector<particle_info>);

        // std::cout << "Read in " << n_particle << " particles" << std::endl;
        for (int ipart = 0; ipart < n_particle; ipart++) {
            int pdg = 0;
            inputfile_mixed_event.read(
                reinterpret_cast<char *>(&pdg), sizeof(int));
            float array[9];
            for (int i = 0; i < 9; i++) {
                float temp = 0.;
                inputfile_mixed_event.read(
                    reinterpret_cast<char *>(&temp), sizeof(float));
                array[i] = temp;
            }

            particle_info temp_particle_info;
            temp_particle_info.monval = pdg;
            temp_particle_info.mass = array[0];
            temp_particle_info.t = array[1];
            temp_particle_info.x = array[2];
            temp_particle_info.y = array[3];
            temp_particle_info.z = array[4];
            temp_particle_info.E = array[5];
            temp_particle_info.px = array[6];
            temp_particle_info.py = array[7];
            temp_particle_info.pz = array[8];

            (*full_particle_list_mixed_event)[ievent]->push_back(
                temp_particle_info);
        }
        num_particles += n_particle;
    }
    return (0);
}